

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_active_nolock_(event *ev,int res,short ncalls)

{
  ushort uVar1;
  event_base *base_00;
  unsigned_long uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  event_callback *peVar6;
  unsigned_long uVar7;
  event_callback *peVar8;
  event_base *base;
  short ncalls_local;
  int res_local;
  event *ev_local;
  
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_active: %p (fd %d), res %d, callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ulong)(uint)res,(ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  base_00 = ev->ev_base;
  if (((base_00->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar5 = evthread_is_debug_lock_held_(base_00->th_base_lock), iVar5 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xb72,"evthread_is_debug_lock_held_((base)->th_base_lock)","event_active_nolock_");
  }
  if (((ev->ev_evcallback).evcb_flags & 0x40U) == 0) {
    uVar1 = (ev->ev_evcallback).evcb_flags;
    uVar3 = uVar1 & 0x28;
    uVar4 = (ushort)res;
    if ((uVar1 & 0x28) == 0) {
      ev->ev_res = uVar4;
    }
    else {
      if (uVar3 == 8) {
        ev->ev_res = ev->ev_res | uVar4;
        return;
      }
      if (uVar3 != 0x20) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xb7c,"0","event_active_nolock_");
      }
      ev->ev_res = ev->ev_res | uVar4;
    }
    if ((int)(uint)(ev->ev_evcallback).evcb_pri < base_00->event_running_priority) {
      base_00->event_continue = 1;
    }
    if ((ev->ev_events & 8U) != 0) {
      peVar8 = base_00->current_event;
      peVar6 = event_to_event_callback(ev);
      if (((peVar8 == peVar6) && (evthread_id_fn_ != (_func_unsigned_long *)0x0)) &&
         ((uVar2 = base_00->th_owner_id, uVar7 = (*evthread_id_fn_)(), uVar2 != uVar7 &&
          (base_00->current_event_waiters = base_00->current_event_waiters + 1,
          base_00->current_event_cond != (void *)0x0)))) {
        (*evthread_cond_fns_.wait_condition)
                  (base_00->current_event_cond,base_00->th_base_lock,(timeval *)0x0);
      }
      (ev->ev_).ev_signal.ev_ncalls = ncalls;
      (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
    }
    peVar8 = event_to_event_callback(ev);
    event_callback_activate_nolock_(base_00,peVar8);
  }
  return;
}

Assistant:

void
event_active_nolock_(struct event *ev, int res, short ncalls)
{
	struct event_base *base;

	event_debug(("event_active: %p (fd "EV_SOCK_FMT"), res %d, callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), (int)res, ev->ev_callback));

	base = ev->ev_base;
	EVENT_BASE_ASSERT_LOCKED(base);

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return;
	}

	switch ((ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		ev->ev_res |= res;
		return;
	case EVLIST_ACTIVE_LATER:
		ev->ev_res |= res;
		break;
	case 0:
		ev->ev_res = res;
		break;
	}

	if (ev->ev_pri < base->event_running_priority)
		base->event_continue = 1;

	if (ev->ev_events & EV_SIGNAL) {
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event == event_to_event_callback(ev) &&
		    !EVBASE_IN_THREAD(base)) {
			++base->current_event_waiters;
			EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
		}
#endif
		ev->ev_ncalls = ncalls;
		ev->ev_pncalls = NULL;
	}

	event_callback_activate_nolock_(base, event_to_event_callback(ev));
}